

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O2

int __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
best_split_propagation
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this,
          vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
          *traversal_path,bool verbose)

{
  double dVar1;
  pointer pTVar2;
  ostream *poVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  TraversalNode *tn;
  pointer pTVar7;
  vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
  *__range2;
  double dVar8;
  vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::SplitDecisionCosts,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::SplitDecisionCosts>_>
  traversal_costs;
  double local_68;
  _Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::SplitDecisionCosts,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::SplitDecisionCosts>_>
  local_58;
  SplitDecisionCosts local_40;
  
  if (this->root_node_->is_leaf_ == true) {
    iVar5 = (int)(this->superroot_->super_AlexNode<int,_int>).level_;
  }
  else {
    local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pTVar2 = (traversal_path->
             super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pTVar7 = (traversal_path->
                  super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                  )._M_impl.super__Vector_impl_data._M_start; pTVar7 != pTVar2; pTVar7 = pTVar7 + 1)
    {
      local_40.stop_cost = 0.0;
      uVar6 = pTVar7->node->num_children_;
      if ((pTVar7->node->children_[pTVar7->bucketID]->duplication_factor_ == '\0') &&
         (local_40.stop_cost = 1.79769313486232e+308,
         (int)uVar6 < (this->derived_params_).max_fanout)) {
        local_40.stop_cost = (double)(int)uVar6 + 8.0;
      }
      local_40.split_cost =
           (double)((ulong)(2 < (int)uVar6) * (long)(double)(int)((uVar6 >> 1) + 8));
      std::
      vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::SplitDecisionCosts,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::SplitDecisionCosts>>
      ::
      emplace_back<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::SplitDecisionCosts>
                ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::SplitDecisionCosts,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::SplitDecisionCosts>>
                  *)&local_58,&local_40);
    }
    dVar8 = 0.0;
    iVar5 = (int)(this->superroot_->super_AlexNode<int,_int>).level_;
    local_68 = 1.79769313486232e+308;
    uVar4 = (ulong)((long)local_58._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_58._M_impl.super__Vector_impl_data._M_start) >> 4 & 0xffffffff;
    while( true ) {
      uVar4 = uVar4 - 1;
      if ((int)(uint)uVar4 < 0) break;
      uVar6 = (uint)uVar4 & 0x7fffffff;
      dVar1 = local_58._M_impl.super__Vector_impl_data._M_start[uVar6].stop_cost;
      if ((dVar1 != 1.79769313486232e+308) || (NAN(dVar1))) {
        if (dVar8 + dVar1 < local_68) {
          iVar5 = (int)(((traversal_path->
                         super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                         )._M_impl.super__Vector_impl_data._M_start[uVar6].node)->
                       super_AlexNode<int,_int>).level_;
          local_68 = dVar8 + dVar1;
        }
      }
      dVar8 = dVar8 + local_58._M_impl.super__Vector_impl_data._M_start[uVar6].split_cost;
    }
    if (verbose) {
      poVar3 = std::operator<<((ostream *)&std::cout,"[Best split propagation] best level: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
      poVar3 = std::operator<<(poVar3,", parent level: ");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,(((traversal_path->
                                   super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                                   )._M_impl.super__Vector_impl_data._M_finish[-1].node)->
                                 super_AlexNode<int,_int>).level_);
      std::operator<<(poVar3,", best cost: ");
      poVar3 = std::ostream::_M_insert<double>(local_68);
      std::operator<<(poVar3,", traversal path (level/addr/n_children): ");
      pTVar2 = (traversal_path->
               super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pTVar7 = (traversal_path->
                    super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                    )._M_impl.super__Vector_impl_data._M_start; pTVar7 != pTVar2;
          pTVar7 = pTVar7 + 1) {
        poVar3 = (ostream *)
                 std::ostream::operator<<
                           (&std::cout,(pTVar7->node->super_AlexNode<int,_int>).level_);
        poVar3 = std::operator<<(poVar3,"/");
        poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
        poVar3 = std::operator<<(poVar3,"/");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pTVar7->node->num_children_);
        std::operator<<(poVar3," ");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    std::
    _Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::SplitDecisionCosts,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::SplitDecisionCosts>_>
    ::~_Vector_base(&local_58);
  }
  return iVar5;
}

Assistant:

int best_split_propagation(const std::vector<TraversalNode>& traversal_path,
                             bool verbose = false) const {
    if (root_node_->is_leaf_) {
      return superroot_->level_;
    }

    // Find costs on the path down to data node
    std::vector<SplitDecisionCosts> traversal_costs;
    for (const TraversalNode& tn : traversal_path) {
      double stop_cost;
      AlexNode<T, P>* next = tn.node->children_[tn.bucketID];
      if (next->duplication_factor_ > 0) {
        stop_cost = 0;
      } else {
        stop_cost =
            tn.node->num_children_ >= derived_params_.max_fanout
                ? std::numeric_limits<double>::max()
                : tn.node->num_children_ + SplitDecisionCosts::base_cost;
      }
      traversal_costs.push_back(
          {stop_cost,
           tn.node->num_children_ <= 2
               ? 0
               : tn.node->num_children_ / 2 + SplitDecisionCosts::base_cost});
    }

    // Compute back upwards to find the optimal node to stop propagation.
    // Ignore the superroot (the first node in the traversal path).
    double cumulative_cost = 0;
    double best_cost = std::numeric_limits<double>::max();
    int best_path_level = superroot_->level_;
    for (int i = traversal_costs.size() - 1; i >= 0; i--) {
      SplitDecisionCosts& c = traversal_costs[i];
      if (c.stop_cost != std::numeric_limits<double>::max() &&
          cumulative_cost + c.stop_cost < best_cost) {
        best_cost = cumulative_cost + c.stop_cost;
        best_path_level = traversal_path[i].node->level_;
      }
      cumulative_cost += c.split_cost;
    }

    if (verbose) {
      std::cout << "[Best split propagation] best level: " << best_path_level
                << ", parent level: " << traversal_path.back().node->level_
                << ", best cost: " << best_cost
                << ", traversal path (level/addr/n_children): ";
      for (const TraversalNode& tn : traversal_path) {
        std::cout << tn.node->level_ << "/" << tn.node << "/"
                  << tn.node->num_children_ << " ";
      }
      std::cout << std::endl;
    }
    return best_path_level;
  }